

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

i16 sqlite3TableColumnToStorage(Table *pTab,i16 iCol)

{
  i16 iVar1;
  long lVar2;
  
  iVar1 = iCol;
  if ((-1 < iCol) && ((pTab->tabFlags & 0x20) != 0)) {
    iVar1 = 0;
    for (lVar2 = 0; (ulong)(ushort)iCol << 4 != lVar2; lVar2 = lVar2 + 0x10) {
      iVar1 = iVar1 + (ushort)((*(byte *)((long)&pTab->aCol->colFlags + lVar2) & 0x20) == 0);
    }
    if ((pTab->aCol[(ushort)iCol].colFlags & 0x20) != 0) {
      return (iCol - iVar1) + pTab->nNVCol;
    }
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE i16 sqlite3TableColumnToStorage(Table *pTab, i16 iCol){
  int i;
  i16 n;
  assert( iCol<pTab->nCol );
  if( (pTab->tabFlags & TF_HasVirtual)==0 || iCol<0 ) return iCol;
  for(i=0, n=0; i<iCol; i++){
    if( (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ) n++;
  }
  if( pTab->aCol[i].colFlags & COLFLAG_VIRTUAL ){
    /* iCol is a virtual column itself */
    return pTab->nNVCol + i - n;
  }else{
    /* iCol is a normal or stored column */
    return n;
  }
}